

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O3

void __thiscall gulcalc::outputcoveragedata(gulcalc *this,int event_id)

{
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *this_00;
  float fVar1;
  pointer pfVar2;
  int iVar3;
  pointer pvVar4;
  pointer pvVar5;
  pointer pfVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  gulcoverageSampleslevel gc;
  gulcoverageSampleslevel local_40;
  
  if ((this->opt_).coverageLevelOutput != false) {
    this_00 = &this->cov_;
    pvVar4 = (this->cov_).
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar5 = (this->cov_).
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (1 < (ulong)(((long)pvVar5 - (long)pvVar4 >> 3) * -0x5555555555555555)) {
      uVar8 = 1;
      do {
        pfVar6 = pvVar4[uVar8].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar2 = *(pointer *)
                  ((long)&pvVar4[uVar8].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data + 8);
        if (pfVar2 != pfVar6) {
          local_40.coverage_id = (int)uVar8;
          local_40.event_id = event_id;
          if (4 < (ulong)((long)pfVar2 - (long)pfVar6)) {
            lVar7 = (long)local_40.coverage_id;
            uVar9 = 1;
            do {
              iVar3 = (int)uVar9;
              local_40.sidx = iVar3 + -2;
              fVar1 = (this->coverages_->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar7];
              local_40.loss = pfVar6[uVar9];
              if (fVar1 < pfVar6[uVar9]) {
                local_40.loss = fVar1;
              }
              if ((iVar3 == 1) || ((iVar3 != 2 && (this->loss_threshold_ <= (double)local_40.loss)))
                 ) {
                covoutputgul(this,&local_40);
              }
              uVar9 = uVar9 + 1;
              pvVar4 = (this_00->
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pfVar6 = pvVar4[uVar8].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
            } while (uVar9 < (ulong)((long)*(pointer *)
                                            ((long)&pvVar4[uVar8].
                                                                                                        
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data + 8) -
                                     (long)pfVar6 >> 2));
            pvVar5 = (this->cov_).
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < (ulong)(((long)pvVar5 - (long)pvVar4 >> 3) * -0x5555555555555555));
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::clear(this_00);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(this_00,(long)(this->coverages_->super__Vector_base<float,_std::allocator<float>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->coverages_->super__Vector_base<float,_std::allocator<float>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 2);
    return;
  }
  return;
}

Assistant:

void gulcalc::outputcoveragedata(int event_id)
{
	if (opt_.coverageLevelOutput == false) return;
	for (size_t j = 1; j < cov_.size(); j++) {
		if (cov_[j].size() > 0) {
			gulcoverageSampleslevel gc;
			gc.event_id = event_id;
			gc.coverage_id = j;
			for (size_t i = 1; i < cov_[j].size(); i++) {
				gc.sidx = i - 2;
				gc.loss = cov_[j][i];
				OASIS_FLOAT tiv = (*coverages_)[gc.coverage_id];
				if (gc.loss > tiv) gc.loss = tiv;
				if (gc.sidx) {
					if (gc.sidx == -1) {
						covoutputgul(gc);		// always output the mean	
					}
					else {
						if (gc.loss >= loss_threshold_) {
							covoutputgul(gc);
						}
					}
				}
			}

		}
	}
	cov_.clear();
	cov_.resize(coverages_->size());
}